

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pnm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  CImgArgumentException *pCVar6;
  CImgIOException *this_00;
  byte *pbVar7;
  ulong uVar8;
  byte bVar9;
  uchar *puVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  size_t sVar21;
  uchar *puVar22;
  bool bVar23;
  bool bVar24;
  uint H;
  uint W;
  uint D;
  CImg<unsigned_char> raw;
  int rval;
  uint colormax;
  undefined8 local_88;
  uint ppm_type;
  ulong local_78;
  FILE *local_70;
  uchar *local_68;
  int bval;
  int gval;
  CImg<char> item;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar18 = "non-";
    if (this->_is_shared != false) {
      pcVar18 = "";
    }
    CImgArgumentException::CImgArgumentException
              (pCVar6,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar18,"unsigned char");
    __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  local_70 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  D = 1;
  colormax = 0xff;
  raw._0_8_ = raw._0_8_ & 0xffffffffffffff00;
  CImg<char>::CImg(&item,0x4000,1,1,1,(char *)&raw);
  while ((iVar2 = __isoc99_fscanf(file,"%16383[^\n]",item._data), iVar2 != -1 &&
         (iVar2 == 0 || *item._data == '#'))) {
    fgetc((FILE *)file);
  }
  iVar2 = __isoc99_sscanf(item._data," P%u",&ppm_type);
  if (iVar2 != 1) {
    if (local_70 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar18 = "non-";
    if (this->_is_shared != false) {
      pcVar18 = "";
    }
    pcVar19 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar19 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar18,"unsigned char",pcVar19);
LAB_001a64e5:
    __cxa_throw(this_00,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  while ((iVar2 = __isoc99_fscanf(file," %16383[^\n]",item._data), iVar2 != -1 &&
         (iVar2 == 0 || *item._data == '#'))) {
    fgetc((FILE *)file);
  }
  iVar2 = __isoc99_sscanf(item._data," %u %u %u %u",&W,&H,&D);
  if (iVar2 < 2) {
    if (local_70 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar18 = "non-";
    if (this->_is_shared != false) {
      pcVar18 = "";
    }
    pcVar19 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar19 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): WIDTH and HEIGHT fields undefined in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar18,"unsigned char",pcVar19);
    goto LAB_001a64e5;
  }
  if ((ppm_type != 1) && (ppm_type != 4)) {
    if ((iVar2 == 2) ||
       (((iVar2 == 3 && (ppm_type < 10)) && ((0x3a0U >> (ppm_type & 0x1f) & 1) != 0)))) {
      while ((iVar2 = __isoc99_fscanf(file," %16383[^\n]",item._data), iVar2 != -1 &&
             (iVar2 == 0 || *item._data == '#'))) {
        fgetc((FILE *)file);
      }
      iVar2 = __isoc99_sscanf(item._data,"%u",&colormax);
      if (iVar2 != 1) {
        pcVar18 = "non-";
        if (this->_is_shared != false) {
          pcVar18 = "";
        }
        pcVar19 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar19 = filename;
        }
        cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): COLORMAX field is undefined in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar18,"unsigned char",pcVar19);
      }
    }
    else {
      colormax = D;
      D = 1;
    }
  }
  fgetc((FILE *)file);
  switch(ppm_type) {
  case 1:
    assign(this,W,H,1,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar16 != 0) {
      puVar22 = this->_data;
      lVar20 = 0;
      do {
        iVar2 = __isoc99_fscanf(file,"%d",&rval);
        if (iVar2 < 1) break;
        puVar22[lVar20] = -(rval == 0);
        lVar20 = lVar20 + 1;
      } while (lVar16 - lVar20 != 0);
    }
    goto LAB_001a61b9;
  case 2:
    assign(this,W,H,1,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar16 != 0) {
      puVar22 = this->_data;
      lVar20 = 0;
      do {
        iVar2 = __isoc99_fscanf(file,"%d",&rval);
        if (iVar2 < 1) break;
        puVar22[lVar20] = (uchar)rval;
        lVar20 = lVar20 + 1;
      } while (lVar16 - lVar20 != 0);
    }
    goto LAB_001a61b9;
  case 3:
    assign(this,W,H,1,3);
    uVar15 = (ulong)(int)this->_height;
    if (0 < (long)uVar15) {
      puVar10 = this->_data;
      lVar16 = (ulong)this->_depth * this->_width * uVar15;
      puVar22 = puVar10 + lVar16 * 2;
      puVar14 = puVar10 + lVar16;
      iVar2 = 0;
      do {
        if (0 < (int)this->_width) {
          lVar16 = 0;
          do {
            iVar3 = __isoc99_fscanf(file,"%d %d %d",&rval,&gval,&bval);
            if (iVar3 != 3) break;
            puVar10[lVar16] = (uchar)rval;
            puVar14[lVar16] = (uchar)gval;
            puVar22[lVar16] = (uchar)bval;
            lVar16 = lVar16 + 1;
          } while ((int)lVar16 < (int)this->_width);
          puVar22 = puVar22 + lVar16;
          puVar14 = puVar14 + lVar16;
          puVar10 = puVar10 + lVar16;
          uVar15 = (ulong)this->_height;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < (int)uVar15);
    }
    goto LAB_001a61b9;
  case 4:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    uVar4 = D * H * (((W >> 3) + 1) - (uint)((W & 7) == 0));
    if (uVar4 != 0) {
      puVar10 = (uchar *)(ulong)uVar4;
      puVar22 = this->_data;
      uVar4 = 0;
      local_88 = local_88 & 0xffffffff00000000;
      uVar12 = 0;
      do {
        local_78 = CONCAT44(local_78._4_4_,uVar4);
        puVar14 = (uchar *)0x1800000;
        if (puVar10 < (uchar *)0x1800000) {
          puVar14 = puVar10;
        }
        assign(&raw,(uint)puVar14,1,1,1);
        puVar14 = raw._data;
        uVar4 = raw._width;
        uVar15 = raw._0_8_ & 0xffffffff;
        if (((FILE *)file == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
          pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar18 = "";
          if (1 < uVar4) {
            pcVar18 = "s";
          }
          CImgArgumentException::CImgArgumentException
                    (pCVar6,
                     "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                     uVar15,"unsigned char",pcVar18,file,puVar14);
          __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
        }
        if (uVar15 != 0) {
          lVar16 = 0;
          local_68 = puVar10;
          do {
            sVar21 = 0x3f00000;
            if (uVar15 < 0x3f00000) {
              sVar21 = uVar15;
            }
            sVar5 = fread(puVar14 + lVar16,1,sVar21,(FILE *)file);
            puVar10 = local_68;
            lVar16 = lVar16 + sVar5;
            uVar15 = uVar15 - sVar5;
          } while ((sVar21 == sVar5) && (uVar15 != 0));
          if (uVar15 != 0) {
            cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16);
          }
        }
        uVar15 = raw._0_8_ & 0xffffffff;
        uVar4 = (uint)local_78;
        if (uVar15 != 0) {
          bVar24 = true;
          bVar23 = false;
          bVar9 = 0;
          pbVar7 = raw._data;
          uVar13 = uVar15;
          puVar14 = puVar22;
          bVar17 = 0;
          do {
            puVar22 = puVar14 + 1;
            if (!bVar23) {
              bVar17 = 0x80;
              if (bVar24) {
                uVar13 = uVar13 - 1;
                bVar9 = *pbVar7;
                pbVar7 = pbVar7 + 1;
              }
              else {
                uVar13 = 0xffffffffffffffff;
              }
            }
            *puVar14 = -((bVar9 & bVar17) == 0);
            uVar12 = uVar12 + 1;
            if (uVar12 == W) {
              uVar12 = 0;
              if ((int)local_88 + 1U == H) {
                uVar4 = uVar4 + 1;
                uVar12 = 0;
                uVar8 = (ulong)local_88._4_4_;
                local_88 = uVar8 << 0x20;
                bVar17 = 0;
                if (uVar4 == D) {
                  local_88 = uVar8 << 0x20;
                  break;
                }
              }
              else {
                local_88 = CONCAT44(local_88._4_4_,(int)local_88 + 1U);
                bVar17 = 0;
              }
            }
            bVar24 = uVar13 != 0;
            bVar23 = 1 < bVar17;
            puVar14 = puVar22;
            bVar17 = bVar17 >> 1;
          } while (bVar24 || bVar23);
        }
        puVar10 = puVar10 + -uVar15;
      } while (0 < (long)puVar10);
    }
    goto joined_r0x001a58f9;
  case 5:
  case 7:
    if (colormax < 0x100) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,D,1);
      uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (0 < (long)uVar15) {
        puVar22 = this->_data;
        do {
          uVar13 = 0x1800000;
          if (uVar15 < 0x1800000) {
            uVar13 = uVar15;
          }
          assign(&raw,(uint)uVar13,1,1,1);
          puVar10 = raw._data;
          uVar4 = raw._width;
          uVar13 = raw._0_8_ & 0xffffffff;
          if (((FILE *)file == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
            pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
            pcVar18 = "";
            if (1 < uVar4) {
              pcVar18 = "s";
            }
            CImgArgumentException::CImgArgumentException
                      (pCVar6,
                       "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                       ,uVar13,"unsigned char",pcVar18,file,puVar10);
            __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
          }
          if (uVar13 != 0) {
            lVar16 = 0;
            local_88 = uVar15;
            local_78 = uVar13;
            do {
              sVar21 = 0x3f00000;
              if (uVar13 < 0x3f00000) {
                sVar21 = uVar13;
              }
              sVar5 = fread(puVar10 + lVar16,1,sVar21,(FILE *)file);
              uVar15 = local_88;
              lVar16 = lVar16 + sVar5;
              uVar13 = uVar13 - sVar5;
            } while ((sVar21 == sVar5) && (uVar13 != 0));
            if (uVar13 != 0) {
              cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16,
                         local_78);
            }
          }
          uVar13 = raw._0_8_ & 0xffffffff;
          if (uVar13 != 0) {
            uVar8 = 0;
            do {
              puVar22[uVar8] = raw._data[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
            puVar22 = puVar22 + uVar8;
          }
          uVar15 = uVar15 - uVar13;
        } while (0 < (long)uVar15);
      }
    }
    else {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,D,1);
      uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (0 < (long)uVar15) {
        puVar22 = this->_data;
        do {
          uVar13 = 0xc00000;
          if (uVar15 < 0xc00000) {
            uVar13 = uVar15;
          }
          CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar13,1,1,1);
          cimg::fread<unsigned_short>((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,file);
          uVar13 = raw._0_8_ & 0xffffffff;
          if (uVar13 != 0) {
            puVar10 = raw._data + uVar13 * 2;
            do {
              puVar1 = (ushort *)(puVar10 + -2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              puVar10 = puVar10 + -2;
            } while (raw._data < puVar10);
            if (uVar13 != 0) {
              uVar8 = 0;
              do {
                puVar22[uVar8] = raw._data[uVar8 * 2];
                uVar8 = uVar8 + 1;
              } while (uVar13 != uVar8);
              puVar22 = puVar22 + uVar8;
            }
          }
          uVar8 = uVar15 - uVar13;
          bVar24 = (long)uVar13 <= (long)uVar15;
          uVar15 = uVar8;
        } while (uVar8 != 0 && bVar24);
      }
    }
joined_r0x001a58f9:
    if ((raw._is_shared != false) || (raw._data == (uchar *)0x0)) goto LAB_001a61b9;
    goto LAB_001a61b4;
  case 6:
    if (colormax < 0x100) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,1,3);
      lVar16 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
      uVar15 = (ulong)this->_spectrum * lVar16;
      if (0 < (long)uVar15) {
        puVar10 = this->_data;
        puVar22 = puVar10 + lVar16 * 2;
        puVar14 = puVar10 + lVar16;
        do {
          uVar13 = 0x1800000;
          if (uVar15 < 0x1800000) {
            uVar13 = uVar15;
          }
          assign(&raw,(uint)uVar13,1,1,1);
          puVar11 = raw._data;
          uVar4 = raw._width;
          uVar13 = raw._0_8_ & 0xffffffff;
          if (((FILE *)file == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
            pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
            pcVar18 = "";
            if (1 < uVar4) {
              pcVar18 = "s";
            }
            CImgArgumentException::CImgArgumentException
                      (pCVar6,
                       "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                       ,uVar13,"unsigned char",pcVar18,file,puVar11);
            __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgException::~CImgException);
          }
          if (uVar13 != 0) {
            lVar16 = 0;
            local_88 = uVar15;
            local_78 = uVar13;
            local_68 = puVar14;
            do {
              sVar21 = 0x3f00000;
              if (uVar13 < 0x3f00000) {
                sVar21 = uVar13;
              }
              sVar5 = fread(puVar11 + lVar16,1,sVar21,(FILE *)file);
              puVar14 = local_68;
              uVar15 = local_88;
              lVar16 = lVar16 + sVar5;
              uVar13 = uVar13 - sVar5;
            } while ((sVar21 == sVar5) && (uVar13 != 0));
            if (uVar13 != 0) {
              cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16,
                         local_78);
            }
          }
          if (2 < (raw._0_8_ & 0xffffffff)) {
            lVar16 = 0;
            do {
              *puVar10 = raw._data[lVar16];
              puVar10 = puVar10 + 1;
              *puVar14 = raw._data[lVar16 + 1];
              puVar14 = puVar14 + 1;
              *puVar22 = raw._data[lVar16 + 2];
              puVar22 = puVar22 + 1;
              lVar16 = lVar16 + 3;
            } while (((raw._0_8_ & 0xffffffff) / 3) * 3 != lVar16);
          }
          uVar15 = uVar15 - (raw._0_8_ & 0xffffffff);
        } while (0 < (long)uVar15);
      }
    }
    else {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,1,3);
      lVar16 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
      uVar15 = (ulong)this->_spectrum * lVar16;
      if (0 < (long)uVar15) {
        puVar10 = this->_data;
        puVar22 = puVar10 + lVar16 * 2;
        puVar14 = puVar10 + lVar16;
        do {
          uVar13 = 0xc00000;
          if (uVar15 < 0xc00000) {
            uVar13 = uVar15;
          }
          CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar13,1,1,1);
          cimg::fread<unsigned_short>((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,file);
          uVar13 = raw._0_8_ & 0xffffffff;
          if (uVar13 != 0) {
            puVar11 = raw._data + uVar13 * 2;
            do {
              puVar1 = (ushort *)(puVar11 + -2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              puVar11 = puVar11 + -2;
            } while (raw._data < puVar11);
            if (2 < raw._width) {
              lVar16 = 0;
              do {
                *puVar10 = raw._data[lVar16];
                puVar10 = puVar10 + 1;
                *puVar14 = raw._data[lVar16 + 2];
                puVar14 = puVar14 + 1;
                *puVar22 = raw._data[lVar16 + 4];
                puVar22 = puVar22 + 1;
                lVar16 = lVar16 + 6;
              } while ((ulong)((uint)(uVar13 * 0xaaaaaaab >> 0x20) & 0xfffffffe) * 3 != lVar16);
            }
          }
          uVar8 = uVar15 - uVar13;
          bVar24 = (long)uVar13 <= (long)uVar15;
          uVar15 = uVar8;
        } while (uVar8 != 0 && bVar24);
      }
    }
    break;
  case 8:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0 < (long)uVar15) {
      puVar22 = this->_data;
      do {
        uVar13 = 0x1800000;
        if (uVar15 < 0x1800000) {
          uVar13 = uVar15;
        }
        CImg<int>::assign((CImg<int> *)&raw,(uint)uVar13,1,1,1);
        cimg::fread<int>((int *)raw._data,raw._0_8_ & 0xffffffff,file);
        uVar13 = raw._0_8_ & 0xffffffff;
        if (uVar13 != 0) {
          uVar8 = 0;
          do {
            puVar22[uVar8] = raw._data[uVar8 * 4];
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
          puVar22 = puVar22 + uVar8;
        }
        uVar15 = uVar15 - uVar13;
      } while (0 < (long)uVar15);
    }
    break;
  case 9:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0 < (long)uVar15) {
      puVar22 = this->_data;
      do {
        uVar13 = 0x1800000;
        if (uVar15 < 0x1800000) {
          uVar13 = uVar15;
        }
        CImg<float>::assign((CImg<float> *)&raw,(uint)uVar13,1,1,1);
        cimg::fread<float>((float *)raw._data,raw._0_8_ & 0xffffffff,file);
        uVar13 = raw._0_8_ & 0xffffffff;
        if (uVar13 != 0) {
          uVar8 = 0;
          do {
            puVar22[uVar8] = (uchar)(int)*(float *)(raw._data + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
          puVar22 = puVar22 + uVar8;
        }
        uVar15 = uVar15 - uVar13;
      } while (0 < (long)uVar15);
    }
    break;
  default:
    if ((this->_is_shared == false) && (this->_data != (uchar *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (uchar *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
    if (local_70 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar18 = "non-";
    if (this->_is_shared != false) {
      pcVar18 = "";
    }
    pcVar19 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar19 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM type \'P%d\' found, but type is not supported."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar18,"unsigned char",pcVar19,(ulong)ppm_type);
    goto LAB_001a64e5;
  }
  if ((raw._is_shared == false) && (raw._data != (uchar *)0x0)) {
LAB_001a61b4:
    operator_delete__(raw._data);
  }
LAB_001a61b9:
  if (local_70 == (FILE *)0x0) {
    if ((FILE *)file == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if (((_stdin != (FILE *)file) && (_stdout != (FILE *)file)) &&
            (uVar4 = fclose((FILE *)file), uVar4 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar4);
    }
  }
  if ((item._is_shared == false) && (item._data != (char *)0x0)) {
    operator_delete__(item._data);
  }
  return this;
}

Assistant:

CImg<T>& _load_pnm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pnm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      unsigned int ppm_type, W, H, D = 1, colormax = 255;
      CImg<charT> item(16384,1,1,1,0);
      int err, rval, gval, bval;
      const longT cimg_iobuffer = (longT)24*1024*1024;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%u",&ppm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %u %u %u %u",&W,&H,&D,&colormax))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): WIDTH and HEIGHT fields undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (ppm_type!=1 && ppm_type!=4) {
        if (err==2 || (err==3 && (ppm_type==5 || ppm_type==7 || ppm_type==8 || ppm_type==9))) {
          while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
          if (cimg_sscanf(item,"%u",&colormax)!=1)
            cimg::warn(_cimg_instance
                       "load_pnm(): COLORMAX field is undefined in file '%s'.",
                       cimg_instance,
                       filename?filename:"(FILE*)");
        } else { colormax = D; D = 1; }
      }
      std::fgetc(nfile);

      switch (ppm_type) {
      case 1 : { // 2D b&w Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)(rval?0:255); else break; }
      } break;
      case 2 : { // 2D grey Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)rval; else break; }
      } break;
      case 3 : { // 2D color Ascii
        assign(W,H,1,3);
        T *ptrd = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forXY(*this,x,y) {
          if (std::fscanf(nfile,"%d %d %d",&rval,&gval,&bval)==3) {
            *(ptrd++) = (T)rval; *(ptr_g++) = (T)gval; *(ptr_b++) = (T)bval;
          } else break;
        }
      } break;
      case 4 : { // 2D b&w binary (support 3D PINK extension)
        CImg<ucharT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        unsigned int w = 0, h = 0, d = 0;
        for (longT to_read = (longT)((W/8 + (W%8?1:0))*H*D); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const unsigned char *ptrs = raw._data;
          unsigned char mask = 0, val = 0;
          for (ulongT off = (ulongT)raw._width; off || mask; mask>>=1) {
            if (!mask) { if (off--) val = *(ptrs++); mask = 128; }
            *(ptrd++) = (T)((val&mask)?0:255);
            if (++w==W) { w = 0; mask = 0; if (++h==H) { h = 0; if (++d==D) break; }}
          }
        }
      } break;
      case 5 : case 7 : { // 2D/3D grey binary (support 3D PINK extension)
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
	    if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        }
      } break;
      case 6 : { // 2D color binary
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
            if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        }
      } break;
      case 8 : { // 2D/3D grey binary with int32 integers (PINK extension)
        CImg<intT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const int *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      case 9 : { // 2D/3D grey binary with float values (PINK extension)
        CImg<floatT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const float *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      default :
        assign();
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM type 'P%d' found, but type is not supported.",
                              cimg_instance,
                              filename?filename:"(FILE*)",ppm_type);
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }